

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

vector<interfaces::WalletAddress,_std::allocator<interfaces::WalletAddress>_> * __thiscall
wallet::anon_unknown_5::WalletImpl::getAddresses
          (vector<interfaces::WalletAddress,_std::allocator<interfaces::WalletAddress>_>
           *__return_storage_ptr__,WalletImpl *this)

{
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device =
       &(((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        cs_wallet).super_recursive_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  (__return_storage_ptr__->
  super__Vector_base<interfaces::WalletAddress,_std::allocator<interfaces::WalletAddress>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<interfaces::WalletAddress,_std::allocator<interfaces::WalletAddress>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<interfaces::WalletAddress,_std::allocator<interfaces::WalletAddress>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30 = _GLOBAL__N_1::std::
             _Function_handler<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_std::optional<wallet::AddressPurpose>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/interfaces.cpp:222:40)>
             ::_M_invoke;
  local_38 = _GLOBAL__N_1::std::
             _Function_handler<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_std::optional<wallet::AddressPurpose>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/interfaces.cpp:222:40)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  local_48._8_8_ = __return_storage_ptr__;
  CWallet::ForEachAddrBookEntry
            ((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,(ListAddrBookFunc *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<WalletAddress> getAddresses() override
    {
        LOCK(m_wallet->cs_wallet);
        std::vector<WalletAddress> result;
        m_wallet->ForEachAddrBookEntry([&](const CTxDestination& dest, const std::string& label, bool is_change, const std::optional<AddressPurpose>& purpose) EXCLUSIVE_LOCKS_REQUIRED(m_wallet->cs_wallet) {
            if (is_change) return;
            isminetype is_mine = m_wallet->IsMine(dest);
            // In very old wallets, address purpose may not be recorded so we derive it from IsMine
            result.emplace_back(dest, is_mine, purpose.value_or(is_mine ? AddressPurpose::RECEIVE : AddressPurpose::SEND), label);
        });
        return result;
    }